

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ConstantPattern::evalImpl
          (ConstantPattern *this,EvalContext *param_2,ConstantValue *value,
          CaseStatementCondition conditionKind)

{
  bool bVar1;
  SVInt *in_RSI;
  ConstantValue *in_RDI;
  int in_R8D;
  SVInt *unaff_retaddr;
  SVInt *in_stack_00000008;
  SVInt *in_stack_00000010;
  SVInt *in_stack_00000018;
  SVInt *r;
  SVInt *l;
  bool result;
  ConstantValue *in_stack_ffffffffffffff88;
  SVInt *integer;
  ConstantValue *pCVar2;
  SVInt local_48;
  SVInt *local_38;
  SVInt *local_30;
  bool local_25;
  int local_24;
  
  pCVar2 = in_RDI;
  if (((in_R8D == 0) ||
      (local_24 = in_R8D, bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x9eaf83), !bVar1
      )) || (bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x9eaf93), !bVar1)) {
    local_25 = slang::operator==(in_RDI,in_stack_ffffffffffffff88);
  }
  else {
    local_30 = slang::ConstantValue::integer((ConstantValue *)0x9eafc8);
    local_38 = slang::ConstantValue::integer((ConstantValue *)0x9eafd7);
    if (local_24 == 2) {
      local_25 = caseZWildcardEqual(in_stack_00000018,in_stack_00000010);
    }
    else {
      local_25 = caseXWildcardEqual(in_stack_00000008,unaff_retaddr);
    }
  }
  integer = &local_48;
  SVInt::SVInt(in_RSI,(bitwidth_t)((ulong)pCVar2 >> 0x20),(uint64_t)in_RDI,
               SUB81((ulong)integer >> 0x38,0));
  slang::ConstantValue::ConstantValue(in_RDI,integer);
  SVInt::~SVInt(in_RSI);
  return pCVar2;
}

Assistant:

ConstantValue ConstantPattern::evalImpl(EvalContext&, const ConstantValue& value,
                                        CaseStatementCondition conditionKind) const {
    SLANG_ASSERT(expr.constant);
    SLANG_ASSERT(conditionKind != CaseStatementCondition::Inside);

    bool result;
    if (conditionKind == CaseStatementCondition::Normal || !expr.constant->isInteger() ||
        !value.isInteger()) {
        result = *expr.constant == value;
    }
    else {
        const SVInt& l = expr.constant->integer();
        const SVInt& r = value.integer();
        if (conditionKind == CaseStatementCondition::WildcardJustZ)
            result = caseZWildcardEqual(l, r);
        else
            result = caseXWildcardEqual(l, r);
    }

    return SVInt(1, result ? 1 : 0, false);
}